

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall irr::core::string<char>::string<char>(string<char> *this,char *c,s32 lenght)

{
  char *pcVar1;
  int local_20;
  s32 l;
  s32 lenght_local;
  char *c_local;
  string<char> *this_local;
  
  this->array = (char *)0x0;
  this->allocated = 0;
  this->used = 0;
  if (c != (char *)0x0) {
    this->used = lenght + 1;
    this->allocated = lenght + 1;
    pcVar1 = (char *)operator_new__((long)this->used);
    this->array = pcVar1;
    for (local_20 = 0; local_20 < lenght; local_20 = local_20 + 1) {
      this->array[local_20] = c[local_20];
    }
    this->array[lenght] = '\0';
  }
  return;
}

Assistant:

string(const B* c, s32 lenght)
	: array(0), allocated(0), used(0)
	{
		if (!c)
			return;

        allocated = used = lenght+1;
		array = new T[used];

		for (s32 l = 0; l<lenght; ++l)
			array[l] = (T)c[l];

		array[lenght] = 0;
	}